

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

var __thiscall cs::range(cs *this,vector *args)

{
  long lVar1;
  numeric *pnVar2;
  numeric *pnVar3;
  numeric *args_2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  lVar1 = (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (lVar1 == 3) {
    cs_impl::check_args<cs::numeric,cs::numeric,cs::numeric>(args);
    pnVar2 = cs_impl::any::const_val<cs::numeric>
                       ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_start);
    pnVar3 = cs_impl::any::const_val<cs::numeric>
                       ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_start + 1);
    args_2 = cs_impl::any::const_val<cs::numeric>
                       ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_start + 2);
    cs_impl::any::
    make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,cs::numeric_const&>
              ((any *)this,pnVar2,pnVar3,args_2);
  }
  else if (lVar1 == 2) {
    cs_impl::check_args<cs::numeric,cs::numeric>(args);
    pnVar2 = cs_impl::any::const_val<cs::numeric>
                       ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_start);
    pnVar3 = cs_impl::any::const_val<cs::numeric>
                       ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_start + 1);
    local_68._M_dataplus._M_p._0_4_ = 1;
    cs_impl::any::make_constant<cs::range_type,cs::numeric_const&,cs::numeric_const&,int>
              ((any *)this,pnVar2,pnVar3,(int *)&local_68);
  }
  else {
    if (lVar1 != 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string
                (&local_48,
                 (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_68,"Wrong size of the arguments. Expected 1, 2 or 3, provided ",
                     &local_48);
      runtime_error::runtime_error(this_00,&local_68);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    cs_impl::check_args<cs::numeric>(args);
    local_68._M_dataplus._M_p._0_4_ = 0;
    pnVar2 = cs_impl::any::const_val<cs::numeric>
                       ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Vector_impl_data._M_start);
    local_48._M_dataplus._M_p._0_4_ = 1;
    cs_impl::any::make_constant<cs::range_type,int,cs::numeric_const&,int>
              ((any *)this,(int *)&local_68,pnVar2,(int *)&local_48);
  }
  return (var)(proxy *)this;
}

Assistant:

var range(vector &args)
	{
		switch (args.size()) {
		case 1:
			cs_impl::check_args<numeric>(args);
			return var::make_constant<range_type>(0, args[0].const_val<numeric>(), 1);
		case 2:
			cs_impl::check_args<numeric, numeric>(args);
			return var::make_constant<range_type>(args[0].const_val<numeric>(), args[1].const_val<numeric>(), 1);
		case 3:
			cs_impl::check_args<numeric, numeric, numeric>(args);
			return var::make_constant<range_type>(args[0].const_val<numeric>(), args[1].const_val<numeric>(),
			                                      args[2].const_val<numeric>());
		default:
			throw cs::runtime_error(
			    "Wrong size of the arguments. Expected 1, 2 or 3, provided " + std::to_string(args.size()));
		}
	}